

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                  PipelineStateCacheDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  PSO_CACHE_MODE PVar2;
  PSO_CACHE_FLAGS PVar3;
  undefined6 uVar4;
  int iVar5;
  size_t sVar6;
  IMemoryAllocator *pIVar7;
  char *pcVar8;
  undefined4 extraout_var_00;
  PipelineStateCacheDesc *Args_1;
  RenderDeviceVkImpl *this_00;
  string msg;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  ObjectBase<Diligent::IPipelineStateCacheVk>::ObjectBase
            (&this->super_ObjectBase<Diligent::IPipelineStateCacheVk>,pRefCounters);
  (this->super_ObjectBase<Diligent::IPipelineStateCacheVk>).
  super_RefCountedObject<Diligent::IPipelineStateCacheVk>.super_IPipelineStateCacheVk.
  super_IPipelineStateCache.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00a50208;
  this->m_pDevice = pDevice;
  PVar2 = ObjDesc->Mode;
  PVar3 = ObjDesc->Flags;
  uVar4 = *(undefined6 *)&ObjDesc->field_0xa;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).Mode = PVar2;
  (this->m_Desc).Flags = PVar3;
  *(undefined6 *)&(this->m_Desc).field_0xa = uVar4;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar5 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar5 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar5 = iVar5 + 1;
  }
  this->m_UniqueID = iVar5;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    this_00 = this->m_pDevice;
    if (this_00 == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice != nullptr"
                 ,(char (*) [21])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = this->m_pDevice;
    }
    RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this_00);
  }
  pcVar8 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar8 == (char *)0x0) {
    pIVar7 = GetStringAllocator();
    iVar5 = (**pIVar7->_vptr_IMemoryAllocator)
                      (pIVar7,0x13,"Object address string",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x55);
    pcVar8 = (char *)CONCAT44(extraout_var_00,iVar5);
    snprintf(pcVar8,0x13,"0x%llX",this);
  }
  else {
    sVar6 = strlen(pcVar8);
    pIVar7 = GetStringAllocator();
    iVar5 = (**pIVar7->_vptr_IMemoryAllocator)
                      (pIVar7,sVar6 + 1,"Object name copy",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x4e);
    pcVar8 = (char *)CONCAT44(extraout_var,iVar5);
    memcpy(pcVar8,(ObjDesc->super_DeviceObjectAttribs).Name,sVar6 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar8;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }